

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

date_time * __thiscall
booster::locale::date_time::operator+=(date_time *this,date_time_period_set *v)

{
  uint uVar1;
  size_t sVar2;
  date_time_period *v_00;
  
  uVar1 = 0;
  while( true ) {
    sVar2 = date_time_period_set::size(v);
    if (sVar2 <= uVar1) break;
    v_00 = date_time_period_set::operator[](v,(ulong)uVar1);
    operator+=(this,v_00);
    uVar1 = uVar1 + 1;
  }
  return this;
}

Assistant:

date_time const &date_time::operator+=(date_time_period_set const &v) 
{
    for(unsigned i=0;i<v.size();i++) {
        *this+=v[i];
    }
    return *this;
}